

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_raw.cpp
# Opt level: O1

void __thiscall ut_raw::df_post_iterator_empty::test_method(df_post_iterator_empty *this)

{
  undefined1 local_14a;
  undefined1 local_149;
  undefined1 *local_148;
  undefined1 *local_140;
  d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_138;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  char *local_100;
  d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  local_f8;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  shared_count sStack_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  undefined1 **local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined8 *local_90;
  undefined1 **local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xd3);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0030e170;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  st_tree::detail::
  d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::d1st_post_iterator(&local_f8,(value_type *)0x0);
  local_138._vptr_d1st_post_iterator = (_func_int **)&PTR__d1st_post_iterator_0030ebf8;
  local_138._stack.
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._stack.
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._stack.
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_149 = st_tree::detail::
              d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator==(&local_f8,&local_138);
  local_140 = &local_149;
  local_148 = &local_14a;
  local_14a = 1;
  local_d0 = 0;
  sStack_c8.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp";
  local_78 = "";
  local_88 = &local_140;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_0030e470;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_148;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0030e470;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_d8[0] = local_149;
  boost::test_tools::tt_detail::report_assertion
            (local_d8,&local_118,&local_80,0xd3,1,2,2,"t1.df_post_begin() == t1.df_post_end()",
             &local_a0,"true",&local_c0);
  boost::detail::shared_count::~shared_count(&sStack_c8);
  local_138._vptr_d1st_post_iterator = (_func_int **)&PTR__d1st_post_iterator_0030ebf8;
  std::
  vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ::~vector(&local_138._stack);
  local_f8._vptr_d1st_post_iterator = (_func_int **)&PTR__d1st_post_iterator_0030ebf8;
  std::
  vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ::~vector(&local_f8._stack);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0xd4);
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_0030e170;
  local_108 = &boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  st_tree::detail::
  d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
  ::d1st_post_iterator(&local_f8,(value_type *)0x0);
  local_138._vptr_d1st_post_iterator = (_func_int **)&PTR__d1st_post_iterator_0030ebf8;
  local_138._stack.
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._stack.
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._stack.
  super__Vector_base<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_149 = st_tree::detail::
              d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>
              ::operator!=(&local_f8,&local_138);
  local_14a = 0;
  local_d8[0] = !(bool)local_149;
  local_d0 = 0;
  sStack_c8.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/erikerlandson[P]st_tree/tests/ut_raw.cpp";
  local_78 = "";
  local_140 = &local_149;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_0030e470;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_88 = &local_140;
  local_148 = &local_14a;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0030e470;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_148;
  boost::test_tools::tt_detail::report_assertion
            (local_d8,&local_118,&local_80,0xd4,1,2,2,"t1.df_post_begin() != t1.df_post_end()",
             &local_a0,"false",&local_c0);
  boost::detail::shared_count::~shared_count(&sStack_c8);
  local_138._vptr_d1st_post_iterator = (_func_int **)&PTR__d1st_post_iterator_0030ebf8;
  std::
  vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ::~vector(&local_138._stack);
  local_f8._vptr_d1st_post_iterator = (_func_int **)&PTR__d1st_post_iterator_0030ebf8;
  std::
  vector<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame,_std::allocator<st_tree::detail::d1st_post_iterator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::allocator<int>_>::frame>_>
  ::~vector(&local_f8._stack);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(df_post_iterator_empty) {
    tree<int> t1;
    BOOST_CHECK_EQUAL(t1.df_post_begin() == t1.df_post_end(), true);
    BOOST_CHECK_EQUAL(t1.df_post_begin() != t1.df_post_end(), false);
}